

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_pageview.cpp
# Opt level: O2

int __thiscall QtMWidgets::PageView::qt_metacall(PageView *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  undefined4 in_register_00000014;
  Call _c_00;
  
  _id_00 = QFrame::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (BindableProperty < _c) {
    return _id_00;
  }
  if ((0x14eU >> (_c & 0x1f) & 1) != 0) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    return _id_00 - 3;
  }
  if (_c == InvokeMetaMethod) {
    if (6 < _id_00) goto LAB_0016402d;
    _c_00 = InvokeMetaMethod;
  }
  else {
    if (_c != RegisterMethodArgumentMetaType) {
      return _id_00;
    }
    if (6 < _id_00) goto LAB_0016402d;
    _c_00 = RegisterMethodArgumentMetaType;
  }
  qt_static_metacall((QObject *)this,_c_00,_id_00,_a);
LAB_0016402d:
  return _id_00 - 7;
}

Assistant:

int QtMWidgets::PageView::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QFrame::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 7)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 7;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 7)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 7;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}